

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

void __thiscall Epoll::epoll_del(Epoll *this,int fd)

{
  int local_14;
  Epoll *pEStack_10;
  int fd_local;
  Epoll *this_local;
  
  local_14 = fd;
  pEStack_10 = this;
  std::
  unordered_map<int,_Epoll::io_event,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>_>
  ::erase(&this->ep_event_map,&local_14);
  std::set<int,_std::less<int>,_std::allocator<int>_>::erase(&this->ep_listen_fds,&local_14);
  epoll_ctl(this->ep_epoll_fd,2,local_14,(epoll_event *)0x0);
  return;
}

Assistant:

void Epoll::epoll_del(int fd) {

    ep_event_map.erase(fd);

    ep_listen_fds.erase(fd);

    epoll_ctl(ep_epoll_fd, EPOLL_CTL_DEL, fd, NULL);
}